

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

DdNode * Extra_bddEncodingBinary
                   (DdManager *dd,DdNode **pbFuncs,int nFuncs,DdNode **pbVars,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  DdNode *n;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *g;
  
  iVar3 = nFuncs;
  if (1 < (uint)nFuncs) {
    uVar2 = nFuncs - 1;
    if (uVar2 == 0) {
      iVar3 = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar3 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  if (iVar3 <= nVars) {
    pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
    Cudd_Ref(pDVar4);
    if (0 < nFuncs) {
      uVar5 = 0;
      g = pDVar4;
      do {
        pDVar4 = Extra_bddBitsToCube(dd,(int)uVar5,nVars,pbVars,1);
        Cudd_Ref(pDVar4);
        n = Cudd_bddAnd(dd,pDVar4,pbFuncs[uVar5]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar4 = Cudd_bddOr(dd,n,g);
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(dd,g);
        Cudd_RecursiveDeref(dd,n);
        uVar5 = uVar5 + 1;
        g = pDVar4;
      } while ((uint)nFuncs != uVar5);
    }
    Cudd_Deref(pDVar4);
    return pDVar4;
  }
  __assert_fail("nVars >= Abc_Base2Log(nFuncs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                ,0x95,"DdNode *Extra_bddEncodingBinary(DdManager *, DdNode **, int, DdNode **, int)"
               );
}

Assistant:

DdNode * 
Extra_bddEncodingBinary( 
  DdManager * dd, 
  DdNode ** pbFuncs,    // pbFuncs is the array of columns to be encoded
  int nFuncs,           // nFuncs is the number of columns in the array
  DdNode ** pbVars,     // pbVars is the array of variables to use for the codes
  int nVars )           // nVars is the column multiplicity, [log2(nFuncs)]
{
    int i;
    DdNode * bResult;
    DdNode * bCube, * bTemp, * bProd;

    assert( nVars >= Abc_Base2Log(nFuncs) );

    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nFuncs; i++ )
    {
        bCube   = Extra_bddBitsToCube( dd, i, nVars, pbVars, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbFuncs[i] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    Cudd_Deref( bResult );
    return bResult;
}